

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate(cmGeneratorExpressionEvaluationFile *this)

{
  uint uVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  ostream *poVar4;
  cmGlobalGenerator *this_00;
  string *config;
  pointer lang;
  allocator local_45d;
  mode_t perm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  auto_ptr<cmCompiledGeneratorExpression> inputExpression;
  cmGeneratorExpression contentGE;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigs;
  string inputContent;
  string local_3d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  outputFiles;
  cmListFileBacktrace lfbt;
  
  perm = 0;
  inputContent._M_dataplus._M_p = (pointer)&inputContent.field_2;
  inputContent._M_string_length = 0;
  inputContent.field_2._M_local_buf[0] = '\0';
  if (this->InputIsContent == true) {
    std::__cxx11::string::_M_assign((string *)&inputContent);
  }
  else {
    pcVar2 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&lfbt,(this->Input)._M_dataplus._M_p,(allocator *)&outputFiles);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar2->ListFiles,(value_type *)&lfbt);
    std::__cxx11::string::~string((string *)&lfbt);
    cmsys::SystemTools::GetPermissions((this->Input)._M_dataplus._M_p,&perm);
    std::ifstream::ifstream(&lfbt,(this->Input)._M_dataplus._M_p,_S_in);
    uVar1 = *(uint *)((long)&lfbt.Snapshot.Position.Tree +
                     lfbt.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
                     super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                     _M_impl.super__Vector_impl_data._M_start[-1].FilePath.field_2.
                     _M_allocated_capacity);
    if ((uVar1 & 5) == 0) {
      outputFiles._M_t._M_impl._0_8_ =
           &outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
           0xffffffffffffff00);
      enabledLanguages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&enabledLanguages.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      enabledLanguages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      enabledLanguages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)enabledLanguages.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      while (bVar3 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&lfbt,(string *)&outputFiles,(bool *)0x0,-1), bVar3) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &allConfigs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &enabledLanguages,(string *)&outputFiles);
        std::__cxx11::string::append((string *)&inputContent);
        std::__cxx11::string::~string((string *)&allConfigs);
        std::__cxx11::string::assign((char *)&enabledLanguages);
      }
      std::__cxx11::string::append((string *)&inputContent);
      std::__cxx11::string::~string((string *)&enabledLanguages);
      std::__cxx11::string::~string((string *)&outputFiles);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputFiles);
      poVar4 = std::operator<<((ostream *)&outputFiles,"Evaluation file \"");
      poVar4 = std::operator<<(poVar4,(string *)this);
      std::operator<<(poVar4,"\" cannot be read.");
      pcVar2 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&enabledLanguages);
      std::__cxx11::string::~string((string *)&enabledLanguages);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputFiles);
    }
    std::ifstream::~ifstream(&lfbt);
    if ((uVar1 & 5) != 0) goto LAB_003667df;
  }
  cmListFileBacktrace::cmListFileBacktrace(&lfbt,&((this->OutputFileExpr).x_)->Backtrace);
  cmGeneratorExpression::cmGeneratorExpression(&contentGE,&lfbt);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&outputFiles,(string *)&contentGE);
  inputExpression.x_ = (cmCompiledGeneratorExpression *)outputFiles._M_t._M_impl._0_8_;
  outputFiles._M_t._M_impl._0_8_ = 0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&outputFiles);
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &outputFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  allConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  allConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cmMakefile::GetConfigurations(&local_3d0,this->Makefile,&allConfigs,true);
  std::__cxx11::string::~string((string *)&local_3d0);
  if (allConfigs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      allConfigs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&enabledLanguages,"",&local_45d);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&allConfigs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &enabledLanguages);
    std::__cxx11::string::~string((string *)&enabledLanguages);
  }
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  enabledLanguages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  cmGlobalGenerator::GetEnabledLanguages(this_00,&enabledLanguages);
  for (lang = enabledLanguages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      config = allConfigs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lang != enabledLanguages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; lang = lang + 1) {
    while (config != allConfigs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
      Generate(this,config,lang,inputExpression.x_,&outputFiles,perm);
      bVar3 = cmSystemTools::GetFatalErrorOccured();
      config = config + 1;
      if (bVar3) goto LAB_0036679d;
    }
  }
LAB_0036679d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&enabledLanguages);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&allConfigs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&outputFiles._M_t);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&inputExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&contentGE);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&lfbt.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
LAB_003667df:
  std::__cxx11::string::~string((string *)&inputContent);
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate()
{
  mode_t perm = 0;
  std::string inputContent;
  if (this->InputIsContent)
    {
    inputContent = this->Input;
    }
  else
    {
    this->Makefile->AddCMakeDependFile(this->Input.c_str());
    cmSystemTools::GetPermissions(this->Input.c_str(), perm);
    cmsys::ifstream fin(this->Input.c_str());
    if(!fin)
      {
      std::ostringstream e;
      e << "Evaluation file \"" << this->Input << "\" cannot be read.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }

    std::string line;
    std::string sep;
    while(cmSystemTools::GetLineFromStream(fin, line))
      {
      inputContent += sep + line;
      sep = "\n";
      }
    inputContent += sep;
    }

  cmListFileBacktrace lfbt = this->OutputFileExpr->GetBacktrace();
  cmGeneratorExpression contentGE(&lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> inputExpression
                                              = contentGE.Parse(inputContent);

  std::map<std::string, std::string> outputFiles;

  std::vector<std::string> allConfigs;
  this->Makefile->GetConfigurations(allConfigs);

  if (allConfigs.empty())
    {
    allConfigs.push_back("");
    }

  std::vector<std::string> enabledLanguages;
  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  gg->GetEnabledLanguages(enabledLanguages);

  for(std::vector<std::string>::const_iterator le = enabledLanguages.begin();
      le != enabledLanguages.end(); ++le)
    {
    for(std::vector<std::string>::const_iterator li = allConfigs.begin();
        li != allConfigs.end(); ++li)
      {
      this->Generate(*li, *le, inputExpression.get(), outputFiles, perm);
      if(cmSystemTools::GetFatalErrorOccured())
        {
        return;
        }
      }
    }
}